

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O2

void duckdb::NextDay(int32_t *year,int32_t *month,int32_t *day)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = *day;
  *day = iVar1 + 1;
  bVar2 = Date::IsValid(*year,*month,iVar1 + 1);
  if (!bVar2) {
    NextMonth(year,month);
    *day = 1;
  }
  return;
}

Assistant:

void NextDay(int32_t &year, int32_t &month, int32_t &day) {
	day++;
	if (!Date::IsValid(year, month, day)) {
		// day is out of range for month, move to next month
		NextMonth(year, month);
		day = 1;
	}
}